

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          ArrayPtr<const_char> *rest,ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,
          ArrayPtr<const_char> *rest_3,ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,
          ArrayPtr<const_char> *rest_6,ArrayPtr<const_char> *rest_7,CappedArray<char,_8UL> *rest_8,
          ArrayPtr<const_char> *rest_9)

{
  size_t sVar1;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    memcpy(pos,first->ptr,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest->size_;
  if (sVar1 != 0) {
    memcpy(pos,rest->ptr,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest_1->size_;
  if (sVar1 != 0) {
    memcpy(pos,rest_1->ptr,sVar1);
    pos = pos + sVar1;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}